

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiGranularityTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_0::GranularityInstance::initAttachmentDescriptions(GranularityInstance *this)

{
  bool bVar1;
  pointer pAVar2;
  __normal_iterator<const_vkt::api::(anonymous_namespace)::AttachmentInfo_*,_std::vector<vkt::api::(anonymous_namespace)::AttachmentInfo,_std::allocator<vkt::api::(anonymous_namespace)::AttachmentInfo>_>_>
  local_48;
  __normal_iterator<const_vkt::api::(anonymous_namespace)::AttachmentInfo_*,_std::vector<vkt::api::(anonymous_namespace)::AttachmentInfo,_std::allocator<vkt::api::(anonymous_namespace)::AttachmentInfo>_>_>
  local_40;
  const_iterator it;
  VkAttachmentDescription attachmentDescription;
  GranularityInstance *this_local;
  
  memset((void *)((long)&it._M_current + 4),0,0x24);
  local_40._M_current =
       (AttachmentInfo *)
       std::
       vector<vkt::api::(anonymous_namespace)::AttachmentInfo,_std::allocator<vkt::api::(anonymous_namespace)::AttachmentInfo>_>
       ::begin(&this->m_attachments);
  while( true ) {
    local_48._M_current =
         (AttachmentInfo *)
         std::
         vector<vkt::api::(anonymous_namespace)::AttachmentInfo,_std::allocator<vkt::api::(anonymous_namespace)::AttachmentInfo>_>
         ::end(&this->m_attachments);
    bVar1 = __gnu_cxx::operator!=(&local_40,&local_48);
    if (!bVar1) break;
    pAVar2 = __gnu_cxx::
             __normal_iterator<const_vkt::api::(anonymous_namespace)::AttachmentInfo_*,_std::vector<vkt::api::(anonymous_namespace)::AttachmentInfo,_std::allocator<vkt::api::(anonymous_namespace)::AttachmentInfo>_>_>
             ::operator->(&local_40);
    checkFormatSupport(this,pAVar2->format);
    __gnu_cxx::
    __normal_iterator<const_vkt::api::(anonymous_namespace)::AttachmentInfo_*,_std::vector<vkt::api::(anonymous_namespace)::AttachmentInfo,_std::allocator<vkt::api::(anonymous_namespace)::AttachmentInfo>_>_>
    ::operator->(&local_40);
    std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::
    push_back(&this->m_attachmentDescriptions,(value_type *)((long)&it._M_current + 4));
    __gnu_cxx::
    __normal_iterator<const_vkt::api::(anonymous_namespace)::AttachmentInfo_*,_std::vector<vkt::api::(anonymous_namespace)::AttachmentInfo,_std::allocator<vkt::api::(anonymous_namespace)::AttachmentInfo>_>_>
    ::operator++(&local_40);
  }
  return;
}

Assistant:

void GranularityInstance::initAttachmentDescriptions (void)
{
	VkAttachmentDescription	attachmentDescription	=
	{
		0u,									// VkAttachmentDescriptionFlags	flags;
		VK_FORMAT_UNDEFINED,				// VkFormat						format;
		VK_SAMPLE_COUNT_1_BIT,				// VkSampleCountFlagBits		samples;
		VK_ATTACHMENT_LOAD_OP_DONT_CARE,	// VkAttachmentLoadOp			loadOp;
		VK_ATTACHMENT_STORE_OP_DONT_CARE,	// VkAttachmentStoreOp			storeOp;
		VK_ATTACHMENT_LOAD_OP_DONT_CARE,	// VkAttachmentLoadOp			stencilLoadOp;
		VK_ATTACHMENT_STORE_OP_DONT_CARE,	// VkAttachmentStoreOp			stencilStoreOp;
		VK_IMAGE_LAYOUT_UNDEFINED,			// VkImageLayout				initialLayout;
		VK_IMAGE_LAYOUT_UNDEFINED,			// VkImageLayout				finalLayout;
	};

	for (std::vector<AttachmentInfo>::const_iterator it = m_attachments.begin(); it != m_attachments.end(); ++it)
	{
		checkFormatSupport(it->format);
		attachmentDescription.format = it->format;
		m_attachmentDescriptions.push_back(attachmentDescription);
	}
}